

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O1

ssize_t phr_decode_chunked(phr_chunked_decoder *decoder,char *buf,size_t *_bufsz)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  size_t sVar11;
  ulong __n;
  
  sVar2 = *_bufsz;
  uVar5 = 0xfffffffffffffffe;
  sVar11 = 0;
  sVar10 = 0;
  do {
    switch(decoder->_state) {
    case '\0':
      while( true ) {
        cVar7 = '\b';
        uVar3 = uVar5;
        if (sVar2 != sVar11) {
          iVar8 = (int)buf[sVar11];
          uVar9 = iVar8 - 0x30;
          if (9 < uVar9) {
            if (iVar8 - 0x41U < 6) {
              uVar9 = iVar8 - 0x37;
            }
            else {
              uVar9 = iVar8 - 0x57;
              if (5 < iVar8 - 0x61U) {
                uVar9 = 0xffffffff;
              }
            }
          }
          if (uVar9 == 0xffffffff) {
            cVar7 = (decoder->_hex_count == '\0') * '\x03' + '\x05';
            uVar3 = -(ulong)(decoder->_hex_count == '\0') | uVar5;
          }
          else {
            uVar3 = 0xffffffffffffffff;
            if (decoder->_hex_count != '\x10') {
              decoder->bytes_left_in_chunk = (long)(int)uVar9 + decoder->bytes_left_in_chunk * 0x10;
              decoder->_hex_count = decoder->_hex_count + '\x01';
              cVar7 = '\0';
              uVar3 = uVar5;
            }
          }
        }
        uVar5 = uVar3;
        if (cVar7 != '\0') break;
        sVar11 = sVar11 + 1;
      }
      if (cVar7 != '\x05') {
        if (cVar7 != '\b') {
          return uVar5;
        }
        goto LAB_00107c9d;
      }
      decoder->_hex_count = '\0';
      decoder->_state = '\x01';
      sVar4 = sVar11;
      sVar6 = sVar11;
      break;
    case '\x01':
      sVar4 = sVar11;
      sVar6 = sVar11;
      break;
    case '\x02':
      goto LAB_00107b40;
    case '\x03':
      sVar6 = sVar11;
      goto joined_r0x00107c0c;
    case '\x04':
      sVar4 = sVar11;
      sVar6 = sVar11;
      do {
        sVar11 = sVar4;
        if (sVar6 == sVar2) goto LAB_00107c9d;
        sVar11 = sVar6 + 1;
        pcVar1 = buf + sVar6;
        sVar4 = sVar2;
        sVar6 = sVar11;
      } while (*pcVar1 == '\r');
      if (*pcVar1 != '\n') {
        decoder->_state = '\x05';
        goto switchD_00107a13_caseD_5;
      }
      goto LAB_00107c97;
    case '\x05':
switchD_00107a13_caseD_5:
      sVar4 = sVar11;
      sVar6 = sVar11;
      do {
        sVar11 = sVar4;
        if (sVar6 == sVar2) goto LAB_00107c9d;
        sVar11 = sVar6 + 1;
        pcVar1 = buf + sVar6;
        sVar4 = sVar2;
        sVar6 = sVar11;
      } while (*pcVar1 != '\n');
      cVar7 = '\x04';
      goto LAB_00107c6e;
    default:
      __assert_fail("!\"decoder is corrupt\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/clask/../clask/picohttpparser.c"
                    ,0x275,
                    "ssize_t phr_decode_chunked(struct phr_chunked_decoder *, char *, size_t *)");
    }
    do {
      sVar11 = sVar4;
      if (sVar6 == sVar2) goto LAB_00107c9d;
      sVar11 = sVar6 + 1;
      pcVar1 = buf + sVar6;
      sVar4 = sVar2;
      sVar6 = sVar11;
    } while (*pcVar1 != '\n');
    if (decoder->bytes_left_in_chunk == 0) {
      cVar7 = '\x04';
      if (decoder->consume_trailer == '\0') {
LAB_00107c97:
        uVar5 = sVar2 - sVar11;
        goto LAB_00107c9d;
      }
    }
    else {
      decoder->_state = '\x02';
LAB_00107b40:
      __n = sVar2 - sVar11;
      uVar3 = decoder->bytes_left_in_chunk;
      if (__n < uVar3) {
        if (sVar10 != sVar11) {
          memmove(buf + sVar10,buf + sVar11,__n);
        }
        decoder->bytes_left_in_chunk = decoder->bytes_left_in_chunk - __n;
        sVar6 = __n;
        sVar11 = sVar2;
      }
      else {
        if (sVar10 != sVar11) {
          memmove(buf + sVar10,buf + sVar11,uVar3);
        }
        sVar6 = decoder->bytes_left_in_chunk;
        sVar11 = sVar11 + sVar6;
        decoder->bytes_left_in_chunk = 0;
        decoder->_state = '\x03';
      }
      sVar10 = sVar10 + sVar6;
      sVar6 = sVar11;
      if (__n < uVar3) {
LAB_00107c9d:
        if (sVar10 != sVar11) {
          memmove(buf + sVar10,buf + sVar11,sVar2 - sVar11);
        }
        *_bufsz = sVar10;
        return uVar5;
      }
joined_r0x00107c0c:
      while( true ) {
        if (sVar6 == sVar2) goto LAB_00107c9d;
        if (buf[sVar6] != '\r') break;
        sVar11 = sVar2;
        sVar6 = sVar6 + 1;
      }
      if (buf[sVar6] != '\n') {
        uVar5 = 0xffffffffffffffff;
        sVar11 = sVar6;
        goto LAB_00107c9d;
      }
      sVar11 = sVar6 + 1;
      cVar7 = '\0';
    }
LAB_00107c6e:
    decoder->_state = cVar7;
  } while( true );
}

Assistant:

ssize_t phr_decode_chunked(struct phr_chunked_decoder *decoder, char *buf, size_t *_bufsz)
{
    size_t dst = 0, src = 0, bufsz = *_bufsz;
    ssize_t ret = -2; /* incomplete */

    while (1) {
        switch (decoder->_state) {
        case CHUNKED_IN_CHUNK_SIZE:
            for (;; ++src) {
                int v;
                if (src == bufsz)
                    goto Exit;
                if ((v = decode_hex(buf[src])) == -1) {
                    if (decoder->_hex_count == 0) {
                        ret = -1;
                        goto Exit;
                    }
                    break;
                }
                if (decoder->_hex_count == sizeof(size_t) * 2) {
                    ret = -1;
                    goto Exit;
                }
                decoder->bytes_left_in_chunk = decoder->bytes_left_in_chunk * 16 + v;
                ++decoder->_hex_count;
            }
            decoder->_hex_count = 0;
            decoder->_state = CHUNKED_IN_CHUNK_EXT;
        /* fallthru */
        case CHUNKED_IN_CHUNK_EXT:
            /* RFC 7230 A.2 "Line folding in chunk extensions is disallowed" */
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            if (decoder->bytes_left_in_chunk == 0) {
                if (decoder->consume_trailer) {
                    decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
                    break;
                } else {
                    goto Complete;
                }
            }
            decoder->_state = CHUNKED_IN_CHUNK_DATA;
        /* fallthru */
        case CHUNKED_IN_CHUNK_DATA: {
            size_t avail = bufsz - src;
            if (avail < decoder->bytes_left_in_chunk) {
                if (dst != src)
                    memmove(buf + dst, buf + src, avail);
                src += avail;
                dst += avail;
                decoder->bytes_left_in_chunk -= avail;
                goto Exit;
            }
            if (dst != src)
                memmove(buf + dst, buf + src, decoder->bytes_left_in_chunk);
            src += decoder->bytes_left_in_chunk;
            dst += decoder->bytes_left_in_chunk;
            decoder->bytes_left_in_chunk = 0;
            decoder->_state = CHUNKED_IN_CHUNK_CRLF;
        }
        /* fallthru */
        case CHUNKED_IN_CHUNK_CRLF:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src] != '\012') {
                ret = -1;
                goto Exit;
            }
            ++src;
            decoder->_state = CHUNKED_IN_CHUNK_SIZE;
            break;
        case CHUNKED_IN_TRAILERS_LINE_HEAD:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src++] == '\012')
                goto Complete;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_MIDDLE;
        /* fallthru */
        case CHUNKED_IN_TRAILERS_LINE_MIDDLE:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
            break;
        default:
            assert(!"decoder is corrupt");
        }
    }

Complete:
    ret = bufsz - src;
Exit:
    if (dst != src)
        memmove(buf + dst, buf + src, bufsz - src);
    *_bufsz = dst;
    return ret;
}